

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType::~IfcMechanicalFastenerType
          (IfcMechanicalFastenerType *this,void **vtt)

{
  void **vtt_local;
  IfcMechanicalFastenerType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType,_0UL> *)
             &(this->super_IfcFastenerType).super_IfcElementComponentType.field_0x1a0,vtt + 0x32);
  IfcFastenerType::~IfcFastenerType(&this->super_IfcFastenerType,vtt + 1);
  return;
}

Assistant:

IfcMechanicalFastenerType() : Object("IfcMechanicalFastenerType") {}